

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O2

void __thiscall
csv::internals::
StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
::next(StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,size_t bytes)

{
  size_t sVar1;
  element_type *peVar2;
  undefined8 *puVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  __uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true> _Var8;
  size_t sVar9;
  ulong uVar10;
  unique_ptr<char[],_std::default_delete<char[]>_> buff;
  __shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2> local_60;
  CSVRow local_50;
  
  if ((this->super_IBasicCSVParser)._eof == false) {
    IBasicCSVParser::reset_data_ptr(&this->super_IBasicCSVParser);
    std::make_shared<std::__cxx11::string>();
    std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)
               (this->super_IBasicCSVParser).data_ptr.
               super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.data.
                super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    sVar9 = (this->super_IBasicCSVParser).source_size;
    if (sVar9 == 0) {
      lVar6 = std::istream::tellg();
      std::istream::seekg((long)&this->_source,_S_beg);
      lVar7 = std::istream::tellg();
      std::istream::seekg((long)&this->_source,_S_beg);
      sVar9 = lVar7 - lVar6;
      (this->super_IBasicCSVParser).source_size = sVar9;
    }
    sVar1 = this->stream_pos;
    uVar10 = sVar9 - sVar1;
    if (bytes <= uVar10) {
      uVar10 = bytes;
    }
    _Var8.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)operator_new__(uVar10);
    buff._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         _Var8.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    std::istream::seekg((long)&this->_source,(_Ios_Seekdir)sVar1);
    std::istream::read((char *)&this->_source,
                       (long)_Var8.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl);
    sVar9 = std::istream::tellg();
    this->stream_pos = sVar9;
    std::__cxx11::string::assign
              ((char *)(((this->super_IBasicCSVParser).data_ptr.
                         super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (ulong)buff._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                      super__Head_base<0UL,_char_*,_false>._M_head_impl);
    peVar2 = (this->super_IBasicCSVParser).data_ptr.
             super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    puVar3 = (undefined8 *)
             (peVar2->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar4 = (char *)*puVar3;
    (peVar2->data)._M_len = puVar3[1];
    (peVar2->data)._M_str = pcVar4;
    std::__shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,
               &(this->super_IBasicCSVParser).data_ptr.
                super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>);
    CSVRow::CSVRow(&local_50,(RawCSVDataPtr *)&local_60);
    CSVRow::operator=(&(this->super_IBasicCSVParser).current_row,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.data.
                super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    sVar9 = IBasicCSVParser::parse(&this->super_IBasicCSVParser);
    uVar5 = (this->super_IBasicCSVParser).source_size;
    if (this->stream_pos == uVar5 || uVar5 < 10000000) {
      (this->super_IBasicCSVParser)._eof = true;
      IBasicCSVParser::end_feed(&this->super_IBasicCSVParser);
    }
    else {
      this->stream_pos = (sVar9 - uVar10) + this->stream_pos;
    }
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&buff);
  }
  return;
}

Assistant:

void next(size_t bytes = ITERATION_CHUNK_SIZE) override {
                if (this->eof()) return;

                this->reset_data_ptr();
                this->data_ptr->_data = std::make_shared<std::string>();

                if (source_size == 0) {
                    const auto start = _source.tellg();
                    _source.seekg(0, std::ios::end);
                    const auto end = _source.tellg();
                    _source.seekg(0, std::ios::beg);

                    source_size = end - start;
                }

                // Read data into buffer
                size_t length = std::min(source_size - stream_pos, bytes);
                std::unique_ptr<char[]> buff(new char[length]);
                _source.seekg(stream_pos, std::ios::beg);
                _source.read(buff.get(), length);
                stream_pos = _source.tellg();
                ((std::string*)(this->data_ptr->_data.get()))->assign(buff.get(), length);

                // Create string_view
                this->data_ptr->data = *((std::string*)this->data_ptr->_data.get());

                // Parse
                this->current_row = CSVRow(this->data_ptr);
                size_t remainder = this->parse();

                if (stream_pos == source_size || no_chunk()) {
                    this->_eof = true;
                    this->end_feed();
                }
                else {
                    this->stream_pos -= (length - remainder);
                }
            }